

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

bool __thiscall EthUdpPort::Init(EthUdpPort *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  
  bVar1 = SocketInternals::Open(this->sockPtr,&this->ServerIP,&this->MulticastIP,this->UDP_port);
  if (bVar1) {
    iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[3])(this);
    cVar2 = (char)iVar3;
    if (cVar2 != '\0') {
      BasePort::SetDefaultProtocol((BasePort *)this);
      if ((this->super_EthBasePort).useFwBridge == true) {
        EthBasePort::OptimizeFirewireGapCount(&this->super_EthBasePort);
      }
    }
  }
  else {
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool EthUdpPort::Init(void)
{
    if (!sockPtr->Open(ServerIP, MulticastIP, UDP_port))
        return false;

    bool ret = ScanNodes();

    if (ret) {
        SetDefaultProtocol();
        if (useFwBridge)
            OptimizeFirewireGapCount();
    }

    //if (!ret)
    //    sockPtr->Close();
    return ret;
}